

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerMSL::analyze_workgroup_variables(CompilerMSL *this)

{
  ParsedIR *this_00;
  uint id;
  TypedID<(spirv_cross::Types)0> *pTVar1;
  size_t sVar2;
  SPIRVariable *var;
  SPIRType *pSVar3;
  long lVar4;
  LoopLock loop_lock;
  LoopLock local_30;
  
  this_00 = &(this->super_CompilerGLSL).super_Compiler.ir;
  ParsedIR::create_loop_hard_lock(this_00);
  pTVar1 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  sVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  for (lVar4 = 0; sVar2 << 2 != lVar4; lVar4 = lVar4 + 4) {
    id = *(uint *)((long)&pTVar1->id + lVar4);
    if ((this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.ptr
        [id].type == TypeVariable) {
      var = ParsedIR::get<spirv_cross::SPIRVariable>(this_00,id);
      if ((var->storage == StorageClassWorkgroup) && ((var->initializer).id != 0)) {
        this->needs_workgroup_zero_init = true;
        pSVar3 = Compiler::get_variable_data_type((Compiler *)this,var);
        if ((pSVar3->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
            buffer_size == 0 && (pSVar3->array).super_VectorView<unsigned_int>.buffer_size == 0) {
          this->suppress_sometimes_unitialized = true;
        }
      }
    }
  }
  ParsedIR::LoopLock::~LoopLock(&local_30);
  return;
}

Assistant:

void CompilerMSL::analyze_workgroup_variables()
{
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		// If workgroup variables have initializer, it can only be ConstantNull (zero init)
		if (var.storage == StorageClassWorkgroup && var.initializer)
		{
			needs_workgroup_zero_init = true;

			// MSL compiler does not like the routine to initialize simple threadgroup variables,
			// falsely claiming it is "sometimes uninitialized". Suppress it.
			auto &type = get_variable_data_type(var);
			if (type.array.empty() && type.member_types.empty())
				suppress_sometimes_unitialized = true;
		}
	});
}